

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManResubVerify(Gia_ResbMan_t *p,word *pFunc)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  int *piVar3;
  word *pwVar4;
  int iVar5;
  word *pwVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  word *pwVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  uVar16 = p->vGates->nSize;
  if ((ulong)uVar16 == 0) {
    return -1;
  }
  if ((int)uVar16 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar1 = p->vGates->pArray[(ulong)uVar16 - 1];
  if ((int)uVar1 < 0) {
    __assert_fail("iTopLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x1cf,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
  }
  if (uVar1 == 1) {
    if ((pFunc != (word *)0x0) && (0 < (long)p->nWords)) {
      memset(pFunc,0xff,(long)p->nWords << 3);
    }
    if ((long)p->nWords < 1) {
      return 1;
    }
    lVar8 = 0;
    while (p->pSets[0][lVar8] == 0) {
      lVar8 = lVar8 + 1;
      if (p->nWords == lVar8) {
        return 1;
      }
    }
  }
  else {
    if (uVar1 != 0) {
      iVar5 = p->vDivs->nSize;
      uVar7 = uVar1 >> 1;
      if ((int)uVar7 < iVar5) {
        if (uVar16 != 1) {
          __assert_fail("Vec_IntSize(p->vGates) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1dc,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        pwVar6 = (word *)p->vDivs->pArray[uVar7];
      }
      else {
        if (uVar16 == 1) {
          __assert_fail("Vec_IntSize(p->vGates) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        if ((uVar16 & 1) == 0) {
          __assert_fail("Vec_IntSize(p->vGates) % 2 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e3,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        if (uVar7 - iVar5 != (uVar16 >> 1) - 1) {
          __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e4,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        pVVar2 = p->vSims;
        iVar14 = uVar16 * p->nWords;
        uVar16 = iVar14 / 2;
        if (pVVar2->nCap < (int)uVar16) {
          if (pVVar2->pArray == (word *)0x0) {
            pwVar6 = (word *)malloc((long)(int)uVar16 << 3);
          }
          else {
            pwVar6 = (word *)realloc(pVVar2->pArray,(long)(int)uVar16 << 3);
          }
          pVVar2->pArray = pwVar6;
          if (pwVar6 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar2->nCap = uVar16;
        }
        if (1 < iVar14) {
          memset(pVVar2->pArray,0,(ulong)uVar16 << 3);
        }
        pVVar2->nSize = uVar16;
        iVar14 = p->vGates->nSize;
        if (1 < iVar14) {
          piVar3 = p->vGates->pArray;
          lVar8 = 0;
          do {
            uVar16 = piVar3[lVar8];
            if (((int)uVar16 < 0) || (uVar7 = piVar3[lVar8 + 1], (int)uVar7 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar15 = uVar16 >> 1;
            if ((int)uVar15 < iVar5) {
              if (p->vDivs->nSize <= (int)uVar15) goto LAB_0079a1c5;
              pwVar6 = (word *)p->vDivs->pArray[uVar15];
            }
            else {
              uVar17 = (uVar15 - iVar5) * p->nWords;
              if (((int)uVar17 < 0) || (p->vSims->nSize <= (int)uVar17)) goto LAB_0079a187;
              pwVar6 = p->vSims->pArray + uVar17;
            }
            uVar17 = uVar7 >> 1;
            if ((int)uVar17 < iVar5) {
              if (p->vDivs->nSize <= (int)uVar17) {
LAB_0079a1c5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pwVar11 = (word *)p->vDivs->pArray[uVar17];
            }
            else {
              uVar10 = (uVar17 - iVar5) * p->nWords;
              if (((int)uVar10 < 0) || (p->vSims->nSize <= (int)uVar10)) goto LAB_0079a187;
              pwVar11 = p->vSims->pArray + uVar10;
            }
            uVar10 = p->nWords;
            uVar9 = (ulong)uVar10;
            uVar13 = (int)((int)lVar8 * uVar10) >> 1;
            if (((int)uVar13 < 0) || (p->vSims->nSize <= (int)uVar13)) goto LAB_0079a187;
            pwVar4 = p->vSims->pArray;
            if (uVar15 < uVar17) {
              if ((uVar16 & 1) == 0) {
                if ((uVar7 & 1) == 0) {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    do {
                      pwVar4[uVar13 + uVar12] = pwVar11[uVar12] & pwVar6[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar9 != uVar12);
                  }
                }
                else if (0 < (int)uVar10) {
                  uVar12 = 0;
                  do {
                    pwVar4[uVar13 + uVar12] = ~pwVar11[uVar12] & pwVar6[uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar9 != uVar12);
                }
              }
              else if ((uVar7 & 1) == 0) {
                if (0 < (int)uVar10) {
                  uVar12 = 0;
                  do {
                    pwVar4[uVar13 + uVar12] = ~pwVar6[uVar12] & pwVar11[uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar9 != uVar12);
                }
              }
              else if (0 < (int)uVar10) {
                uVar12 = 0;
                do {
                  pwVar4[uVar13 + uVar12] = ~(pwVar11[uVar12] | pwVar6[uVar12]);
                  uVar12 = uVar12 + 1;
                } while (uVar9 != uVar12);
              }
            }
            else {
              if (uVar15 <= uVar17) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                              ,0x1f5,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
              }
              if ((uVar16 & 1) != 0) {
                __assert_fail("!Abc_LitIsCompl(iLit0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                              ,0x1f1,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
              }
              if ((uVar7 & 1) != 0) {
                __assert_fail("!Abc_LitIsCompl(iLit1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                              ,0x1f2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
              }
              if (0 < (int)uVar10) {
                uVar12 = 0;
                do {
                  pwVar4[uVar13 + uVar12] = pwVar11[uVar12] ^ pwVar6[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar9 != uVar12);
              }
            }
            lVar8 = lVar8 + 2;
          } while ((int)((uint)lVar8 | 1) < iVar14);
        }
        uVar16 = (iVar14 / 2 + -1) * p->nWords;
        if (((int)uVar16 < 0) || (p->vSims->nSize <= (int)uVar16)) {
LAB_0079a187:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar6 = p->vSims->pArray + uVar16;
      }
      uVar16 = p->nWords;
      uVar9 = (ulong)uVar16;
      if ((uVar1 & 1) == 0) {
        if (0 < (int)uVar16) {
          iVar5 = 0;
          uVar12 = 0;
          do {
            if ((pwVar6[uVar12] & p->pSets[0][uVar12]) != 0) goto LAB_0079a139;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        iVar5 = 1;
        if (0 < (int)uVar16) {
          uVar12 = 0;
          do {
            if ((p->pSets[1][uVar12] & ~pwVar6[uVar12]) != 0) goto LAB_0079a137;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
      }
      else {
        if (0 < (int)uVar16) {
          iVar5 = 0;
          uVar12 = 0;
          do {
            if ((pwVar6[uVar12] & p->pSets[1][uVar12]) != 0) goto LAB_0079a139;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        iVar5 = 1;
        if (0 < (int)uVar16) {
          uVar12 = 0;
          do {
            if ((p->pSets[0][uVar12] & ~pwVar6[uVar12]) != 0) goto LAB_0079a137;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
      }
      goto LAB_0079a139;
    }
    if ((pFunc != (word *)0x0) && (0 < (long)p->nWords)) {
      memset(pFunc,0,(long)p->nWords << 3);
    }
    if ((long)p->nWords < 1) {
      return 1;
    }
    lVar8 = 0;
    while (p->pSets[1][lVar8] == 0) {
      lVar8 = lVar8 + 1;
      if (p->nWords == lVar8) {
        return 1;
      }
    }
  }
  return 0;
LAB_0079a137:
  iVar5 = 0;
LAB_0079a139:
  if (pFunc != (word *)0x0) {
    uVar16 = p->nWords;
    if ((uVar1 & 1) == 0) {
      if (0 < (int)uVar16) {
        uVar9 = 0;
        do {
          pFunc[uVar9] = pwVar6[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar16 != uVar9);
      }
    }
    else if (0 < (int)uVar16) {
      uVar9 = 0;
      do {
        pFunc[uVar9] = ~pwVar6[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
    }
  }
  return iVar5;
}

Assistant:

int Gia_ManResubVerify( Gia_ResbMan_t * p, word * pFunc )
{
    int nVars = Vec_PtrSize(p->vDivs);
    int iTopLit, RetValue;
    word * pDivRes; 
    if ( Vec_IntSize(p->vGates) == 0 )
        return -1;
    iTopLit = Vec_IntEntryLast(p->vGates);
    assert( iTopLit >= 0 );
    if ( iTopLit == 0 )
    {
        if ( pFunc ) Abc_TtClear( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[1], p->nWords );
    }
    if ( iTopLit == 1 )
    {
        if ( pFunc ) Abc_TtFill( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[0], p->nWords );
    }
    if ( Abc_Lit2Var(iTopLit) < nVars )
    {
        assert( Vec_IntSize(p->vGates) == 1 );
        pDivRes = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iTopLit) );
    }
    else
    {
        int i, iLit0, iLit1;
        assert( Vec_IntSize(p->vGates) > 1 );
        assert( Vec_IntSize(p->vGates) % 2 == 1 );
        assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1 );
        Vec_WrdFill( p->vSims, p->nWords * Vec_IntSize(p->vGates)/2, 0 );
        Vec_IntForEachEntryDouble( p->vGates, iLit0, iLit1, i )
        {
            int iVar0 = Abc_Lit2Var(iLit0);
            int iVar1 = Abc_Lit2Var(iLit1);
            word * pDiv0 = iVar0 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar0) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar0 - nVars));
            word * pDiv1 = iVar1 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar1) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar1 - nVars));
            word * pDiv  = Vec_WrdEntryP(p->vSims, p->nWords*i/2);
            if ( iVar0 < iVar1 )
                Abc_TtAndCompl( pDiv, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), p->nWords );
            else if ( iVar0 > iVar1 )
            {
                assert( !Abc_LitIsCompl(iLit0) );
                assert( !Abc_LitIsCompl(iLit1) );
                Abc_TtXor( pDiv, pDiv0, pDiv1, p->nWords, 0 );
            }
            else assert( 0 );
        }
        pDivRes = Vec_WrdEntryP( p->vSims, p->nWords*(Vec_IntSize(p->vGates)/2-1) );
    }
    if ( Abc_LitIsCompl(iTopLit) )
        RetValue = !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 1, p->nWords);
    else
        RetValue = !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 1, p->nWords);
    if ( pFunc ) Abc_TtCopy( pFunc, pDivRes, p->nWords, Abc_LitIsCompl(iTopLit) );
    return RetValue;
}